

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptExpr.cpp
# Opt level: O2

void __thiscall GlobOpt::ProcessArrayValueKills(GlobOpt *this,Instr *instr)

{
  OpCode OVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  HelperCallOpnd *pHVar5;
  uint uVar6;
  Opnd *this_00;
  
  OVar1 = instr->m_opcode;
  if ((((0x35 < OVar1 - 0x70) || ((0x3014000f0f0145U >> ((ulong)(OVar1 - 0x70) & 0x3f) & 1) == 0))
      && ((0xc < OVar1 - 0x127 || ((0x1805U >> (OVar1 - 0x127 & 0x1f) & 1) == 0)))) &&
     (((0x35 < OVar1 - 0x1f7 || ((0x20000000000083U >> ((ulong)(OVar1 - 0x1f7) & 0x3f) & 1) == 0))
      && (1 < OVar1 - 0x269)))) {
    if (OVar1 == CallDirect) {
      this_00 = instr->m_src1;
      if (this_00 == (Opnd *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar4 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptExpr.cpp"
                           ,0x350,"(instr->GetSrc1())","instr->GetSrc1()");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar4 = 0;
        this_00 = instr->m_src1;
      }
      pHVar5 = IR::Opnd::AsHelperCallOpnd(this_00);
      uVar6 = pHVar5->m_fnHelper - HelperArray_Concat;
      if ((0x10 < uVar6) || ((0x1b001U >> (uVar6 & 0x1f) & 1) == 0)) {
        return;
      }
    }
    else {
      bVar3 = IR::Instr::UsesAllFields(instr);
      if (!bVar3) {
        return;
      }
    }
  }
  BVSparse<Memory::JitArenaAllocator>::ClearAll((this->currentBlock->globOptData).liveArrayValues);
  return;
}

Assistant:

void
GlobOpt::ProcessArrayValueKills(IR::Instr *instr)
{
    switch (instr->m_opcode)
    {
    case Js::OpCode::StElemC:
    case Js::OpCode::StElemI_A:
    case Js::OpCode::StElemI_A_Strict:
    case Js::OpCode::DeleteElemI_A:
    case Js::OpCode::DeleteElemIStrict_A:
    case Js::OpCode::ConsoleScopedStFld:
    case Js::OpCode::ConsoleScopedStFldStrict:
    case Js::OpCode::ScopedStFld:
    case Js::OpCode::ScopedStFldStrict:
    case Js::OpCode::StFld:
    case Js::OpCode::StRootFld:
    case Js::OpCode::StFldStrict:
    case Js::OpCode::StRootFldStrict:
    case Js::OpCode::StSuperFld:
    case Js::OpCode::StSuperFldStrict:
    case Js::OpCode::StSlot:
    case Js::OpCode::StSlotChkUndecl:
    case Js::OpCode::DeleteFld:
    case Js::OpCode::DeleteRootFld:
    case Js::OpCode::DeleteFldStrict:
    case Js::OpCode::DeleteRootFldStrict:
    case Js::OpCode::ScopedDeleteFld:
    case Js::OpCode::ScopedDeleteFldStrict:
    case Js::OpCode::StArrViewElem:
    // These array helpers may change A.length (and A[i] could be A.length)...
    case Js::OpCode::InlineArrayPush:
    case Js::OpCode::InlineArrayPop:
        this->currentBlock->globOptData.liveArrayValues->ClearAll();
        break;

    case Js::OpCode::CallDirect:
        Assert(instr->GetSrc1());
        switch(instr->GetSrc1()->AsHelperCallOpnd()->m_fnHelper)
        {
            // These array helpers may change A[i]
            case IR::HelperArray_Reverse:
            case IR::HelperArray_Shift:
            case IR::HelperArray_Unshift:
            case IR::HelperArray_Splice:
            case IR::HelperArray_Concat:
                this->currentBlock->globOptData.liveArrayValues->ClearAll();
                break;
        }
        break;
    default:
        if (instr->UsesAllFields())
        {
            this->currentBlock->globOptData.liveArrayValues->ClearAll();
        }
        break;
    }
}